

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

st__table *
st__init_table_with_params
          (st__compare_func_type compare,st__hash_func_type hash,int size,int density,
          double grow_factor,int reorder_flag)

{
  st__table *__ptr;
  st__table_entry **ppsVar1;
  ulong uVar2;
  
  __ptr = (st__table *)malloc(0x30);
  if (__ptr != (st__table *)0x0) {
    __ptr->compare = compare;
    __ptr->hash = hash;
    __ptr->num_entries = 0;
    __ptr->max_density = density;
    __ptr->grow_factor = grow_factor;
    __ptr->reorder_flag = reorder_flag;
    uVar2 = 1;
    if (1 < size) {
      uVar2 = (ulong)(uint)size;
    }
    __ptr->num_bins = (int)uVar2;
    ppsVar1 = (st__table_entry **)calloc(1,uVar2 << 3);
    __ptr->bins = ppsVar1;
    if (ppsVar1 != (st__table_entry **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (st__table *)0x0;
}

Assistant:

st__table *
 st__init_table_with_params( st__compare_func_type compare, st__hash_func_type hash, int size, int density, double grow_factor, int reorder_flag)
{
    int i;
    st__table *newTable;

    newTable = ABC_ALLOC( st__table, 1);
    if (newTable == NULL) {
    return NULL;
    }
    newTable->compare = compare;
    newTable->hash = hash;
    newTable->num_entries = 0;
    newTable->max_density = density;
    newTable->grow_factor = grow_factor;
    newTable->reorder_flag = reorder_flag;
    if (size <= 0) {
    size = 1;
    }
    newTable->num_bins = size;
    newTable->bins = ABC_ALLOC( st__table_entry *, size);
    if (newTable->bins == NULL) {
    ABC_FREE(newTable);
    return NULL;
    }
    for(i = 0; i < size; i++) {
    newTable->bins[i] = 0;
    }
    return newTable;
}